

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2dTest.c
# Opt level: O2

void main(void)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long M;
  long lVar4;
  float *data;
  float *data_00;
  FILE *__s;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  char *__s_00;
  long kernSize2;
  long kernSize;
  size_t local_60;
  long local_58;
  long local_50;
  long local_48;
  long dataSize2;
  long dataSize;
  
  kernSize = 0x35;
  kernSize2 = 0x1d;
  dataSize = 0xcc;
  dataSize2 = 0x24;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  M = lround(8.0);
  bVar1 = (byte)M;
  lVar7 = 1L << (bVar1 & 0x3f);
  lVar4 = lround(5.999999999999999);
  lVar6 = 1L << ((byte)lVar4 & 0x3f);
  printf("fft size = %6ld X%6ld,  ",lVar6,lVar7);
  iVar2 = fft2dInit(lVar4,M);
  sVar8 = lVar6 << (bVar1 & 0x3f);
  data = (float *)calloc(sVar8,4);
  iVar3 = 2;
  if (data != (float *)0x0) {
    iVar3 = iVar2;
  }
  __s_00 = " out of memory ";
  if (iVar3 != 2) {
    if (iVar3 == 0) {
      data_00 = (float *)calloc(sVar8,4);
      if (data_00 == (float *)0x0) goto LAB_0010141d;
      __s = fopen("conv2ddat.c2d","wb");
      if (__s != (FILE *)0x0) {
        local_60 = sVar8;
        local_58 = lVar4;
        local_50 = lVar7;
        local_48 = lVar6;
        fwrite(&dataSize,8,1,__s);
        fwrite(&dataSize2,8,1,__s);
        fwrite(&kernSize,8,1,__s);
        fwrite(&kernSize2,8,1,__s);
        sVar8 = dataSize * 4;
        lVar6 = 0;
        lVar4 = dataSize;
        if (dataSize < 1) {
          lVar4 = lVar6;
        }
        lVar7 = dataSize2;
        if (dataSize2 < 1) {
          lVar7 = lVar6;
        }
        for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
          for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
            iVar3 = rand();
            (data + (lVar6 << (bVar1 & 0x3f)))[lVar5] = (float)iVar3 * 9.313226e-10 + -1.0;
          }
          fwrite(data + (lVar6 << (bVar1 & 0x3f)),sVar8,1,__s);
        }
        sVar8 = kernSize * 4;
        lVar6 = 0;
        lVar4 = kernSize;
        if (kernSize < 1) {
          lVar4 = lVar6;
        }
        lVar7 = kernSize2;
        if (kernSize2 < 1) {
          lVar7 = lVar6;
        }
        for (; lVar5 = local_58, lVar6 != lVar7; lVar6 = lVar6 + 1) {
          for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
            iVar3 = rand();
            (data_00 + (lVar6 << (bVar1 & 0x3f)))[lVar5] = (float)iVar3 * 9.313226e-10 + -1.0;
          }
          fwrite(data_00 + (lVar6 << (bVar1 & 0x3f)),sVar8,1,__s);
        }
        rfft2d(data,local_58,M);
        rfft2d(data_00,lVar5,M);
        rspect2dprod(data,data_00,data,local_48,local_50);
        rifft2d(data,lVar5,M);
        fwrite(data,local_60 << 2,1,__s);
        fclose(__s);
        free(data_00);
        free(data);
        goto LAB_00101425;
      }
    }
    __s_00 = " error ";
  }
LAB_0010141d:
  puts(__s_00);
LAB_00101425:
  fft2dFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
long 	N = 256;	/* the number of cols in 2d ffts, must be power of 2 */
long 	N2 = 64;	/* the number of rows in 2d ffts, must be power of 2 */
long 	kernSize = 53;	/* kernal cols must be less than N */
long 	kernSize2 = 29;	/* kernal rows must be less than N2*/
long 	dataSize = N-kernSize+1;	/* data cols */
long 	dataSize2 = N2-kernSize2+1;	/* data rows */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;
long		M2;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);
M2 = lround(LOG2(N2));
N2 = POW2(M2);

printf("fft size = %6ld X%6ld,  ", N2, N);

if ((dataSize <= 0)||(dataSize2 <= 0)) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fft2dInit(M2, M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("conv2ddat.c2d", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&dataSize2, sizeof(dataSize2), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&kernSize2, sizeof(kernSize2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<dataSize2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<kernSize2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}

	/* fast 2d convolution of zero padded sequences */
	rfft2d(a, M2, M);
	rfft2d(b, M2, M);
	rspect2dprod(a, b, a, N2, N);
	rifft2d(a, M2, M);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fft2dFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fft2dFree();
}
printf(" Done. \n");
return;
}